

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceStatement
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Type *method;
  ServiceOptions *this_00;
  LocationRecorder location;
  LocationRecorder LStack_38;
  
  bVar1 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  bVar2 = true;
  if (!bVar1) {
    iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar3 == 0) {
      LocationRecorder::LocationRecorder(&LStack_38,service_location,3);
      *(byte *)(service->_has_bits_).has_bits_ = (byte)(service->_has_bits_).has_bits_[0] | 2;
      if (service->options_ == (ServiceOptions *)0x0) {
        this_00 = (ServiceOptions *)operator_new(0x70);
        ServiceOptions::ServiceOptions(this_00);
        service->options_ = this_00;
      }
      bVar2 = ParseOption(this,&service->options_->super_Message,&LStack_38,containing_file,
                          OPTION_STATEMENT);
    }
    else {
      LocationRecorder::LocationRecorder
                (&LStack_38,service_location,2,
                 (service->method_).super_RepeatedPtrFieldBase.current_size_);
      method = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
                         (&(service->method_).super_RepeatedPtrFieldBase,(Type *)0x0);
      bVar2 = ParseServiceMethod(this,method,&LStack_38,containing_file);
    }
    LocationRecorder::~LocationRecorder(&LStack_38);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseServiceStatement(ServiceDescriptorProto* service,
                                   const LocationRecorder& service_location,
                                   const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("option")) {
    LocationRecorder location(
        service_location, ServiceDescriptorProto::kOptionsFieldNumber);
    return ParseOption(service->mutable_options(), location,
                       containing_file, OPTION_STATEMENT);
  } else {
    LocationRecorder location(service_location,
        ServiceDescriptorProto::kMethodFieldNumber, service->method_size());
    return ParseServiceMethod(service->add_method(), location, containing_file);
  }
}